

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

uint64_t __thiscall kratos::XXHash64::hash(XXHash64 *this)

{
  uchar *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  
  if (this->totalLength < 0x20) {
    lVar5 = this->state[2] + 0x27d4eb2f165667c5;
  }
  else {
    uVar2 = this->state[0];
    uVar6 = this->state[1];
    uVar3 = this->state[2];
    uVar4 = this->state[3];
    lVar5 = ((uVar4 * -0x6c158a5880000000 | uVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar6 * -0x6c158a5880000000 | uVar6 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            ((uVar2 * -0x6c158a5880000000 | uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
             -0x61c8864e7a143579 ^
            (uVar4 << 0x12 | uVar4 >> 0x2e) + (uVar3 << 0xc | uVar3 >> 0x34) +
            (uVar6 << 7 | uVar6 >> 0x39) + (uVar2 << 1 | (ulong)((long)uVar2 < 0))) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
            -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  uVar6 = lVar5 + this->totalLength;
  puVar8 = this->buffer;
  puVar7 = this->buffer + this->bufferSize;
  if (7 < (ulong)this->bufferSize) {
    do {
      uVar6 = (*(long *)puVar8 * -0x6c158a5880000000 |
              (ulong)(*(long *)puVar8 * -0x3d4d51c2d82b14b1) >> 0x21) * -0x61c8864e7a143579 ^ uVar6;
      uVar6 = (uVar6 << 0x1b | uVar6 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      puVar1 = puVar8 + 8;
      puVar9 = puVar8 + 0x10;
      puVar8 = puVar1;
    } while (puVar9 <= puVar7);
  }
  if (puVar8 + 4 <= puVar7) {
    uVar6 = (ulong)*(uint *)puVar8 * -0x61c8864e7a143579 ^ uVar6;
    uVar6 = (uVar6 << 0x17 | uVar6 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    puVar8 = puVar8 + 4;
  }
  for (; puVar8 != puVar7; puVar8 = puVar8 + 1) {
    uVar6 = (ulong)*puVar8 * 0x27d4eb2f165667c5 ^ uVar6;
    uVar6 = (uVar6 << 0xb | uVar6 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar6 = (uVar6 >> 0x21 ^ uVar6) * -0x3d4d51c2d82b14b1;
  uVar6 = (uVar6 >> 0x1d ^ uVar6) * 0x165667b19e3779f9;
  return uVar6 >> 0x20 ^ uVar6;
}

Assistant:

[[nodiscard]] uint64_t hash() const {
        // fold 256 bit state into one single 64 bit value
        uint64_t result;
        if (totalLength >= MaxBufferSize) {
            result = rotateLeft(state[0], 1) + rotateLeft(state[1], 7) + rotateLeft(state[2], 12) +
                     rotateLeft(state[3], 18);
            result = (result ^ processSingle(0, state[0])) * Prime1 + Prime4;
            result = (result ^ processSingle(0, state[1])) * Prime1 + Prime4;
            result = (result ^ processSingle(0, state[2])) * Prime1 + Prime4;
            result = (result ^ processSingle(0, state[3])) * Prime1 + Prime4;
        } else {
            // internal state wasn't set in add(), therefore original seed is still stored in state2
            result = state[2] + Prime5;
        }

        result += totalLength;

        // process remaining bytes in temporary buffer
        const unsigned char* data = buffer;
        // point beyond last byte
        const unsigned char* stop = data + bufferSize;

        // at least 8 bytes left ? => eat 8 bytes per step
        for (; data + 8 <= stop; data += 8)
            result = rotateLeft(result ^ processSingle(0, *(uint64_t*)data), 27) * Prime1 + Prime4;

        // 4 bytes left ? => eat those
        if (data + 4 <= stop) {
            result = rotateLeft(result ^ (*(uint32_t*)data) * Prime1, 23) * Prime2 + Prime3;
            data += 4;
        }

        // take care of remaining 0..3 bytes, eat 1 byte per step
        while (data != stop) result = rotateLeft(result ^ (*data++) * Prime5, 11) * Prime1;

        // mix bits
        result ^= result >> 33u;
        result *= Prime2;
        result ^= result >> 29u;
        result *= Prime3;
        result ^= result >> 32u;
        return result;
    }